

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O1

void DumpInternal(PtexTexture *tx)

{
  undefined8 in_RAX;
  long *plVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  poVar2 = (ostream *)&std::cout;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Header:\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  magic: ",9);
  if (*(int *)&tx[0x11]._vptr_PtexTexture == 0x78657450) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'Ptex\'",6);
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  version: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_38 = CONCAT17(0x2e,(undefined7)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 7),1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  meshtype: ",0xc);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  datatype: ",0xc);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  alphachan: ",0xd);
  plVar1 = (long *)std::ostream::operator<<(poVar2,*(int *)&tx[0x13]._vptr_PtexTexture);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  nchannels: ",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  nlevels: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  nfaces: ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  extheadersize: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  faceinfosize: ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  constdatasize: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  levelinfosize: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  leveldatasize: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  metadatazipsize: ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  metadatamemsize: ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ubordermode: ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  vbordermode: ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  lmdheaderzipsize: ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  lmdheadermemsize: ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  lmddatasize: ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  editdatasize: ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  editdatapos: ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Level info:\n",0xc);
  if (*(short *)((long)&tx[0x13]._vptr_PtexTexture + 6) != 0) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Level ",8);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    leveldatasize: ",0x13);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    levelheadersize: ",0x15);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    nfaces: ",0xc);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(ushort *)((long)&tx[0x13]._vptr_PtexTexture + 6));
  }
  return;
}

Assistant:

void DumpInternal(PtexTexture* tx)
{
    PtexReader* r = static_cast<PtexReader*> (tx);

    const PtexIO::Header& h = r->header();
    const PtexIO::ExtHeader& eh = r->extheader();
    std::cout << "Header:\n"
              << "  magic: ";

    if (h.magic == PtexIO::Magic)
        std::cout << "'Ptex'" << std::endl;
    else
        std::cout << h.magic << std::endl;

    std::cout << "  version: " << h.version << '.' << h.minorversion << std::endl
              << "  meshtype: " << h.meshtype << std::endl
              << "  datatype: " << h.datatype << std::endl
              << "  alphachan: " << int(h.alphachan) << std::endl
              << "  nchannels: " << h.nchannels << std::endl
              << "  nlevels: " << h.nlevels << std::endl
              << "  nfaces: " << h.nfaces << std::endl
              << "  extheadersize: " << h.extheadersize << std::endl
              << "  faceinfosize: " << h.faceinfosize << std::endl
              << "  constdatasize: " << h.constdatasize << std::endl
              << "  levelinfosize: " << h.levelinfosize << std::endl
              << "  leveldatasize: " << h.leveldatasize << std::endl
              << "  metadatazipsize: " << h.metadatazipsize << std::endl
              << "  metadatamemsize: " << h.metadatamemsize << std::endl
              << "  ubordermode: " << eh.ubordermode << std::endl
              << "  vbordermode: " << eh.vbordermode << std::endl
              << "  lmdheaderzipsize: " << eh.lmdheaderzipsize << std::endl
              << "  lmdheadermemsize: " << eh.lmdheadermemsize << std::endl
              << "  lmddatasize: " << eh.lmddatasize << std::endl
              << "  editdatasize: " << eh.editdatasize << std::endl
              << "  editdatapos: " << eh.editdatapos << std::endl;

    std::cout << "Level info:\n";
    for (int i = 0; i < h.nlevels; i++) {
        const PtexIO::LevelInfo& l = r->levelinfo(i);
        std::cout << "  Level " << i << std::endl
                  << "    leveldatasize: " << l.leveldatasize << std::endl
                  << "    levelheadersize: " << l.levelheadersize << std::endl
                  << "    nfaces: " << l.nfaces << std::endl;
    }
}